

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.h
# Opt level: O0

void __thiscall benchmark::BenchmarkReporter::Run::Run(Run *this)

{
  Run *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->report_label);
  this->iterations = 1;
  this->real_accumulated_time = 0.0;
  this->cpu_accumulated_time = 0.0;
  this->bytes_per_second = 0.0;
  this->items_per_second = 0.0;
  this->max_heapbytes_used = 0.0;
  return;
}

Assistant:

Run() :
      iterations(1),
      real_accumulated_time(0),
      cpu_accumulated_time(0),
      bytes_per_second(0),
      items_per_second(0),
      max_heapbytes_used(0) {}